

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  key_type kVar12;
  value_type vVar13;
  size_type in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff808;
  int in_stack_fffffffffffff80c;
  value_type in_stack_fffffffffffff810;
  value_type in_stack_fffffffffffff814;
  undefined2 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff822;
  undefined1 in_stack_fffffffffffff823;
  undefined4 in_stack_fffffffffffff824;
  undefined4 in_stack_fffffffffffff828;
  undefined1 in_stack_fffffffffffff82c;
  undefined1 in_stack_fffffffffffff82d;
  undefined1 in_stack_fffffffffffff82e;
  undefined1 in_stack_fffffffffffff82f;
  undefined4 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff834;
  undefined1 in_stack_fffffffffffff835;
  undefined1 in_stack_fffffffffffff836;
  undefined1 in_stack_fffffffffffff837;
  Type type;
  undefined4 in_stack_fffffffffffff840;
  uint i_00;
  string local_798 [8];
  char *in_stack_fffffffffffff870;
  char *in_stack_fffffffffffff878;
  char *in_stack_fffffffffffff880;
  AssertionResult *in_stack_fffffffffffff888;
  AssertHelper *in_stack_fffffffffffff890;
  AssertionResult local_760 [6];
  value_type local_6f8;
  int local_6f4;
  value_type *in_stack_fffffffffffff948;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff950;
  int local_694;
  string local_690 [55];
  undefined1 local_659;
  AssertionResult local_658 [6];
  value_type local_5ec;
  string local_5e8 [55];
  byte local_5b1;
  AssertionResult local_5b0;
  string local_5a0 [55];
  undefined1 local_569;
  AssertionResult local_568 [6];
  value_type local_4fc;
  string local_4f8 [55];
  byte local_4c1;
  AssertionResult local_4c0;
  string local_4b0 [55];
  undefined1 local_479;
  AssertionResult local_478 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3c8 [2];
  string local_3a8 [55];
  undefined1 local_371;
  AssertionResult local_370;
  string local_360 [55];
  byte local_329;
  AssertionResult local_328;
  string local_318 [55];
  undefined1 local_2e1;
  AssertionResult local_2e0;
  key_type local_2cc;
  string local_2c8 [55];
  byte local_291;
  AssertionResult local_290;
  string local_280 [55];
  undefined1 local_249;
  AssertionResult local_248;
  string local_238 [55];
  byte local_201;
  AssertionResult local_200;
  string local_1f0 [55];
  undefined1 local_1b9;
  AssertionResult local_1b8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1a8 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0 [13];
  
  i_00 = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             in_stack_fffffffffffff80c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             in_stack_fffffffffffff80c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d0,i_00,(int *)(ulong)i_00);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff840),in_RDI,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff837,
                      CONCAT16(in_stack_fffffffffffff836,
                               CONCAT15(in_stack_fffffffffffff835,
                                        CONCAT14(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                )))),
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff82f,
                      CONCAT16(in_stack_fffffffffffff82e,
                               CONCAT15(in_stack_fffffffffffff82d,
                                        CONCAT14(in_stack_fffffffffffff82c,in_stack_fffffffffffff828
                                                )))),
             (allocator_type *)
             CONCAT44(in_stack_fffffffffffff824,
                      CONCAT13(in_stack_fffffffffffff823,
                               CONCAT12(in_stack_fffffffffffff822,in_stack_fffffffffffff820))));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d0);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             in_stack_fffffffffffff80c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             in_stack_fffffffffffff80c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_1a8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff840),in_RDI,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff837,
                      CONCAT16(in_stack_fffffffffffff836,
                               CONCAT15(in_stack_fffffffffffff835,
                                        CONCAT14(in_stack_fffffffffffff834,in_stack_fffffffffffff830
                                                )))),
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff82f,
                      CONCAT16(in_stack_fffffffffffff82e,
                               CONCAT15(in_stack_fffffffffffff82d,
                                        CONCAT14(in_stack_fffffffffffff82c,in_stack_fffffffffffff828
                                                )))),
             (allocator_type *)
             CONCAT44(in_stack_fffffffffffff824,
                      CONCAT13(in_stack_fffffffffffff823,
                               CONCAT12(in_stack_fffffffffffff822,in_stack_fffffffffffff820))));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_1a8);
  uVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_1b9 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee3db0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff836,
                                               CONCAT15(in_stack_fffffffffffff835,
                                                        CONCAT14(in_stack_fffffffffffff834,
                                                                 in_stack_fffffffffffff830)))),
               CONCAT13(in_stack_fffffffffffff82f,
                        CONCAT12(in_stack_fffffffffffff82e,
                                 CONCAT11(in_stack_fffffffffffff82d,in_stack_fffffffffffff82c))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_1f0);
    testing::Message::~Message((Message *)0xee3ef4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee3f88);
  uVar3 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_201 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee3fc6)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff835,
                                                              CONCAT14(in_stack_fffffffffffff834,
                                                                       in_stack_fffffffffffff830))))
               ,CONCAT13(in_stack_fffffffffffff82f,
                         CONCAT12(in_stack_fffffffffffff82e,
                                  CONCAT11(in_stack_fffffffffffff82d,in_stack_fffffffffffff82c))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_238);
    testing::Message::~Message((Message *)0xee409b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee412f);
  uVar4 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_249 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee4170)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_248);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffff834,
                                                  in_stack_fffffffffffff830)))),
               CONCAT13(in_stack_fffffffffffff82f,
                        CONCAT12(in_stack_fffffffffffff82e,
                                 CONCAT11(in_stack_fffffffffffff82d,in_stack_fffffffffffff82c))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_280);
    testing::Message::~Message((Message *)0xee4245);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee42d9);
  uVar5 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_291 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee431c)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_290);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff830)))),
               CONCAT13(in_stack_fffffffffffff82f,
                        CONCAT12(in_stack_fffffffffffff82e,
                                 CONCAT11(in_stack_fffffffffffff82d,in_stack_fffffffffffff82c))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_2c8);
    testing::Message::~Message((Message *)0xee43f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee4488);
  kVar12 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       in_stack_fffffffffffff80c);
  local_2cc = kVar12;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                    (key_type *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  uVar6 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_2e1 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee4500)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(in_stack_fffffffffffff82e,
                                       CONCAT11(in_stack_fffffffffffff82d,in_stack_fffffffffffff82c)
                                      )),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_318);
    testing::Message::~Message((Message *)0xee45d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee4669);
  uVar7 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_329 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee46ac)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_328);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(in_stack_fffffffffffff82d,
                                                      in_stack_fffffffffffff82c))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_360);
    testing::Message::~Message((Message *)0xee4781);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee4815);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
           CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  uVar8 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_371 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee486a)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_370);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,in_stack_fffffffffffff82c))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_3a8);
    testing::Message::~Message((Message *)0xee493f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee49d6);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             in_stack_fffffffffffff80c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_3c8,2,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff840),in_RDI,
             (hasher *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
             (key_equal *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff82c,
                                                                   in_stack_fffffffffffff828)))),
             (allocator_type *)
             CONCAT44(in_stack_fffffffffffff824,
                      CONCAT13(in_stack_fffffffffffff823,
                               CONCAT12(in_stack_fffffffffffff822,in_stack_fffffffffffff820))));
  uVar9 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_479 = uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee4a6a)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_478);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_4b0);
    testing::Message::~Message((Message *)0xee4b71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee4c05);
  bVar2 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_4c1 = ~bVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee4c48)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(in_stack_fffffffffffff824,
                                CONCAT13(in_stack_fffffffffffff823,
                                         CONCAT12(in_stack_fffffffffffff822,
                                                  in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_4f8);
    testing::Message::~Message((Message *)0xee4d1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee4db4);
  vVar13 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                          in_stack_fffffffffffff80c);
  local_4fc = vVar13;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  uVar10 = google::
           BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                        (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_569 = uVar10;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee4e34)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_568);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(in_stack_fffffffffffff822,
                                                                in_stack_fffffffffffff820))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_5a0);
    testing::Message::~Message((Message *)0xee4f09);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee4f9d);
  uVar11 = google::
           BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                        (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  local_5b1 = ~uVar11 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee4fe0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(uVar11,in_stack_fffffffffffff820))))
    ;
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_5e8);
    testing::Message::~Message((Message *)0xee50b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee514c);
  local_5ec = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                             in_stack_fffffffffffff80c);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  local_659 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                           (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),(type *)0xee51cc)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_658);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),(Type)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(uVar11,in_stack_fffffffffffff820))))
    ;
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_690);
    testing::Message::~Message((Message *)0xee52a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee5335);
  for (local_694 = 3; local_694 < 0x7d1; local_694 = local_694 + 1) {
    in_stack_fffffffffffff814 =
         HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                        in_stack_fffffffffffff80c);
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  for (local_6f4 = 2000; type = (Type)(in_RDI >> 0x20), 2 < local_6f4; local_6f4 = local_6f4 + -1) {
    in_stack_fffffffffffff810 =
         HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                        in_stack_fffffffffffff80c);
    local_6f8 = in_stack_fffffffffffff810;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  }
  bVar2 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool *)CONCAT44(CONCAT13(bVar2,(int3)in_stack_fffffffffffff80c),
                              in_stack_fffffffffffff808),(type *)0xee5461);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_760);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT44(i_00,in_stack_fffffffffffff840));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               in_stack_fffffffffffff870);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(i_00,in_stack_fffffffffffff840),type,
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,kVar12)))),
               CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))),
               (char *)CONCAT44(vVar13,CONCAT13(uVar10,CONCAT12(uVar11,in_stack_fffffffffffff820))))
    ;
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff890,(Message *)in_stack_fffffffffffff888);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    std::__cxx11::string::~string(local_798);
    testing::Message::~Message((Message *)0xee551b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xee55a9);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee55b6);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3c8);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee55d0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xee55dd);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}